

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringNewArray(TranslateToFuzzReader *this)

{
  HeapType type;
  Expression *ref;
  Expression *start;
  Expression *end;
  StringNew *pSVar1;
  
  type = getArrayTypeForString(this);
  ref = makeTrappingRefUse(this,type);
  start = make(this,(Type)0x2);
  end = make(this,(Type)0x2);
  pSVar1 = Builder::makeStringNew(&this->builder,StringNewWTF16Array,ref,start,end);
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringNewArray() {
  auto* array = makeTrappingRefUse(getArrayTypeForString());
  auto* start = make(Type::i32);
  auto* end = make(Type::i32);
  return builder.makeStringNew(StringNewWTF16Array, array, start, end);
}